

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

int UnloadEnv(void)

{
  double local_68;
  double local_60;
  interval local_58;
  double local_40;
  double local_38;
  interval local_30;
  box local_18;
  
  angle_env = 0.0;
  lat_env = 0.0;
  long_env = 0.0;
  alt_env = 0.0;
  nb_circles = 0;
  std::vector<double,_std::allocator<double>_>::clear(&circles_x);
  std::vector<double,_std::allocator<double>_>::clear(&circles_y);
  std::vector<double,_std::allocator<double>_>::clear(&circles_r);
  nb_walls = 0;
  std::vector<double,_std::allocator<double>_>::clear(&walls_xa);
  std::vector<double,_std::allocator<double>_>::clear(&walls_ya);
  std::vector<double,_std::allocator<double>_>::clear(&walls_xb);
  std::vector<double,_std::allocator<double>_>::clear(&walls_yb);
  local_38 = -10.0;
  local_40 = 10.0;
  interval::interval(&local_30,&local_38,&local_40);
  local_60 = -10.0;
  local_68 = 10.0;
  interval::interval(&local_58,&local_60,&local_68);
  box::box(&local_18,(vector<interval,_std::allocator<interval>_> *)&local_30,
           (vector<interval,_std::allocator<interval>_> *)&local_58);
  box::operator=(&box_env,&local_18);
  box::~box(&local_18);
  csMap.xMin = -10.0;
  csMap.xMax = 10.0;
  csMap.yMin = -10.0;
  csMap.yMax = 10.0;
  return 0;
}

Assistant:

inline int UnloadEnv(void)
{
	// Default values.
	angle_env = M_PI/2.0-90.0*M_PI/180.0;
	lat_env = 0;
	long_env = 0;
	alt_env = 0;
	nb_circles = 0;
	circles_x.clear();
	circles_y.clear();
	circles_r.clear();
	nb_walls = 0;
	walls_xa.clear();
	walls_ya.clear();
	walls_xb.clear();
	walls_yb.clear();
	box_env = box(interval(-10,10),interval(-10,10));
	csMap.xMin = -10; csMap.xMax = 10; csMap.yMin = -10; csMap.yMax = 10; 

	return EXIT_SUCCESS;
}